

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

char * classend(MatchState *ms,char *p)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar3 = p + 2;
    }
    cVar1 = p[(ulong)(p[1] == '^') + 1];
    do {
      if (cVar1 == '\0') {
        luaL_error(ms->L,"malformed pattern (missing \']\')");
        cVar1 = *pcVar3;
      }
      pcVar2 = pcVar3 + 1;
      if ((cVar1 == '%') && (pcVar3[1] != '\0')) {
        pcVar2 = pcVar3 + 2;
      }
      cVar1 = *pcVar2;
      pcVar3 = pcVar2;
    } while (cVar1 != ']');
    pcVar3 = pcVar2 + 1;
  }
  else if (*p == '%') {
    if (*pcVar3 == '\0') {
      luaL_error(ms->L,"malformed pattern (ends with \'%%\')");
    }
    pcVar3 = p + 2;
  }
  return pcVar3;
}

Assistant:

static const char *classend (MatchState *ms, const char *p) {
  switch (*p++) {
    case L_ESC: {
      if (*p == '\0')
        luaL_error(ms->L, "malformed pattern (ends with " LUA_QL("%%") ")");
      return p+1;
    }
    case '[': {
      if (*p == '^') p++;
      do {  /* look for a `]' */
        if (*p == '\0')
          luaL_error(ms->L, "malformed pattern (missing " LUA_QL("]") ")");
        if (*(p++) == L_ESC && *p != '\0')
          p++;  /* skip escapes (e.g. `%]') */
      } while (*p != ']');
      return p+1;
    }
    default: {
      return p;
    }
  }
}